

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RemoveVCProcess.cpp
# Opt level: O0

void __thiscall Assimp::RemoveVCProcess::Execute(RemoveVCProcess *this,aiScene *pScene)

{
  aiMaterial *this_00;
  Logger *pLVar1;
  bool bVar2;
  bool bVar3;
  uint local_448;
  undefined1 local_444 [4];
  uint a;
  aiString s;
  undefined1 local_34 [8];
  aiColor3D clr;
  aiMaterial *helper;
  uint i;
  bool bHas;
  aiScene *pScene_local;
  RemoveVCProcess *this_local;
  
  pLVar1 = DefaultLogger::get();
  Logger::debug(pLVar1,"RemoveVCProcess begin");
  this->mScene = pScene;
  bVar2 = (this->configDeleteFlags & 0x40) != 0;
  if (bVar2) {
    ArrayDelete<aiAnimation>(&pScene->mAnimations,&pScene->mNumAnimations);
  }
  bVar3 = (this->configDeleteFlags & 0x80) != 0;
  if (bVar3) {
    ArrayDelete<aiTexture>(&pScene->mTextures,&pScene->mNumTextures);
  }
  helper._7_1_ = bVar3 || bVar2;
  if (((this->configDeleteFlags & 0x800) != 0) && (pScene->mNumMaterials != 0)) {
    helper._7_1_ = true;
    for (helper._0_4_ = 1; (uint)helper < pScene->mNumMaterials; helper._0_4_ = (uint)helper + 1) {
      this_00 = pScene->mMaterials[(uint)helper];
      if (this_00 != (aiMaterial *)0x0) {
        aiMaterial::~aiMaterial(this_00);
        operator_delete(this_00);
      }
    }
    pScene->mNumMaterials = 1;
    clr._4_8_ = *pScene->mMaterials;
    if ((aiMaterial *)clr._4_8_ == (aiMaterial *)0x0) {
      __assert_fail("__null != helper",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/PostProcessing/RemoveVCProcess.cpp"
                    ,0xb1,"virtual void Assimp::RemoveVCProcess::Execute(aiScene *)");
    }
    aiMaterial::Clear((aiMaterial *)clr._4_8_);
    aiColor3D::aiColor3D((aiColor3D *)local_34,0.6,0.6,0.6);
    aiMaterial::AddProperty((aiMaterial *)clr._4_8_,(aiColor3D *)local_34,1,"$clr.diffuse",0,0);
    aiColor3D::aiColor3D((aiColor3D *)(s.data + 0x3f8),0.05,0.05,0.05);
    aiColor3D::operator=((aiColor3D *)local_34,(aiColor3D *)(s.data + 0x3f8));
    aiMaterial::AddProperty((aiMaterial *)clr._4_8_,(aiColor3D *)local_34,1,"$clr.ambient",0,0);
    aiString::aiString((aiString *)local_444);
    aiString::Set((aiString *)local_444,"Dummy_MaterialsRemoved");
    aiMaterial::AddProperty((aiMaterial *)clr._4_8_,(aiString *)local_444,"?mat.name",0,0);
  }
  if ((this->configDeleteFlags & 0x100) != 0) {
    helper._7_1_ = true;
    ArrayDelete<aiLight>(&pScene->mLights,&pScene->mNumLights);
  }
  if ((this->configDeleteFlags & 0x200) != 0) {
    helper._7_1_ = true;
    ArrayDelete<aiCamera>(&pScene->mCameras,&pScene->mNumCameras);
  }
  if ((this->configDeleteFlags & 0x400) == 0) {
    for (local_448 = 0; local_448 < pScene->mNumMeshes; local_448 = local_448 + 1) {
      bVar2 = ProcessMesh(this,pScene->mMeshes[local_448]);
      if (bVar2) {
        helper._7_1_ = true;
      }
    }
  }
  else {
    helper._7_1_ = true;
    ArrayDelete<aiMesh>(&pScene->mMeshes,&pScene->mNumMeshes);
  }
  if ((pScene->mNumMeshes == 0) || (pScene->mNumMaterials == 0)) {
    pScene->mFlags = pScene->mFlags | 1;
    pLVar1 = DefaultLogger::get();
    Logger::debug(pLVar1,"Setting AI_SCENE_FLAGS_INCOMPLETE flag");
    if (pScene->mNumMeshes == 0) {
      pScene->mFlags = pScene->mFlags & 0xfffffff7;
    }
  }
  if (helper._7_1_) {
    pLVar1 = DefaultLogger::get();
    Logger::info(pLVar1,"RemoveVCProcess finished. Data structure cleanup has been done.");
  }
  else {
    pLVar1 = DefaultLogger::get();
    Logger::debug(pLVar1,"RemoveVCProcess finished. Nothing to be done ...");
  }
  return;
}

Assistant:

void RemoveVCProcess::Execute( aiScene* pScene)
{
    ASSIMP_LOG_DEBUG("RemoveVCProcess begin");
    bool bHas = false; //,bMasked = false;

    mScene = pScene;

    // handle animations
    if ( configDeleteFlags & aiComponent_ANIMATIONS)
    {

        bHas = true;
        ArrayDelete(pScene->mAnimations,pScene->mNumAnimations);
    }

    // handle textures
    if ( configDeleteFlags & aiComponent_TEXTURES)
    {
        bHas = true;
        ArrayDelete(pScene->mTextures,pScene->mNumTextures);
    }

    // handle materials
    if ( configDeleteFlags & aiComponent_MATERIALS && pScene->mNumMaterials)
    {
        bHas = true;
        for (unsigned int i = 1;i < pScene->mNumMaterials;++i)
            delete pScene->mMaterials[i];

        pScene->mNumMaterials = 1;
        aiMaterial* helper = (aiMaterial*) pScene->mMaterials[0];
        ai_assert(NULL != helper);
        helper->Clear();

        // gray
        aiColor3D clr(0.6f,0.6f,0.6f);
        helper->AddProperty(&clr,1,AI_MATKEY_COLOR_DIFFUSE);

        // add a small ambient color value
        clr = aiColor3D(0.05f,0.05f,0.05f);
        helper->AddProperty(&clr,1,AI_MATKEY_COLOR_AMBIENT);

        aiString s;
        s.Set("Dummy_MaterialsRemoved");
        helper->AddProperty(&s,AI_MATKEY_NAME);
    }

    // handle light sources
    if ( configDeleteFlags & aiComponent_LIGHTS)
    {
        bHas =  true;
        ArrayDelete(pScene->mLights,pScene->mNumLights);
    }

    // handle camneras
    if ( configDeleteFlags & aiComponent_CAMERAS)
    {
        bHas = true;
        ArrayDelete(pScene->mCameras,pScene->mNumCameras);
    }

    // handle meshes
    if (configDeleteFlags & aiComponent_MESHES)
    {
        bHas = true;
        ArrayDelete(pScene->mMeshes,pScene->mNumMeshes);
    }
    else
    {
        for( unsigned int a = 0; a < pScene->mNumMeshes; a++)
        {
            if( ProcessMesh( pScene->mMeshes[a]))
                bHas = true;
        }
    }


    // now check whether the result is still a full scene
    if (!pScene->mNumMeshes || !pScene->mNumMaterials)
    {
        pScene->mFlags |= AI_SCENE_FLAGS_INCOMPLETE;
        ASSIMP_LOG_DEBUG("Setting AI_SCENE_FLAGS_INCOMPLETE flag");

        // If we have no meshes anymore we should also clear another flag ...
        if (!pScene->mNumMeshes)
            pScene->mFlags &= ~AI_SCENE_FLAGS_NON_VERBOSE_FORMAT;
    }

    if (bHas) {
        ASSIMP_LOG_INFO("RemoveVCProcess finished. Data structure cleanup has been done.");
    } else {
        ASSIMP_LOG_DEBUG("RemoveVCProcess finished. Nothing to be done ...");
    }
}